

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lyd_parser_set_data_flags
                 (lyd_node *node,lyd_meta **meta,lyd_ctx *lydctx,lysc_ext_instance *ext)

{
  lyd_meta *plVar1;
  LY_ERR LVar2;
  int iVar3;
  lysc_when *plVar4;
  lyd_node *parent;
  undefined8 *object;
  ly_ctx *local_60;
  LY_ERR ret___1;
  LY_ERR ret__;
  lyd_ctx_ext_val *ext_val;
  lyd_meta *next_meta;
  lyd_meta *prev_meta;
  lyd_meta *meta2;
  lysc_ext_instance *ext_local;
  lyd_ctx *lydctx_local;
  lyd_meta **meta_local;
  lyd_node *node_local;
  
  next_meta = (lyd_meta *)0x0;
  if ((lydctx->parse_opts & 0x1000000) != 0) {
    node->flags = node->flags & 0xfffffffb;
  }
  plVar4 = lysc_has_when(node->schema);
  if (plVar4 != (lysc_when *)0x0) {
    if ((lydctx->parse_opts & 0x800000) != 0) {
      node->flags = node->flags | 2;
    }
    if (((lydctx->parse_opts & 0x10000) == 0) &&
       (LVar2 = ly_set_add(&lydctx->node_when,node,'\x01',(uint32_t *)0x0), LVar2 != LY_SUCCESS)) {
      return LVar2;
    }
  }
  prev_meta = *meta;
  do {
    if (prev_meta == (lyd_meta *)0x0) {
LAB_001a84e2:
      if ((ext != (lysc_ext_instance *)0x0) &&
         (node->flags = node->flags | 8, (lydctx->parse_opts & 0x10000) == 0)) {
        object = (undefined8 *)malloc(0x10);
        if (object == (undefined8 *)0x0) {
          if (node->schema == (lysc_node *)0x0) {
            local_60 = (ly_ctx *)node[2].schema;
          }
          else {
            local_60 = node->schema->module->ctx;
          }
          ly_log(local_60,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lyd_parser_set_data_flags");
          return LY_EMEM;
        }
        *object = ext;
        object[1] = node;
        LVar2 = ly_set_add(&lydctx->ext_val,object,'\x01',(uint32_t *)0x0);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
      }
      return LY_SUCCESS;
    }
    iVar3 = strcmp(prev_meta->name,"default");
    if (((iVar3 == 0) &&
        (iVar3 = strcmp(prev_meta->annotation->module->name,"ietf-netconf-with-defaults"),
        iVar3 == 0)) && ((prev_meta->value).field_2.boolean != '\0')) {
      node->flags = node->flags | 1;
      plVar1 = prev_meta->next;
      if (meta != &node->meta) {
        *meta = (*meta)->next;
      }
      lyd_free_meta_single(prev_meta);
      if (next_meta != (lyd_meta *)0x0) {
        next_meta->next = plVar1;
      }
      parent = lyd_parent(node);
      lyd_np_cont_dflt_set(parent);
      goto LAB_001a84e2;
    }
    next_meta = prev_meta;
    prev_meta = prev_meta->next;
  } while( true );
}

Assistant:

LY_ERR
lyd_parser_set_data_flags(struct lyd_node *node, struct lyd_meta **meta, struct lyd_ctx *lydctx,
        struct lysc_ext_instance *ext)
{
    struct lyd_meta *meta2, *prev_meta = NULL, *next_meta = NULL;
    struct lyd_ctx_ext_val *ext_val;

    if (lydctx->parse_opts & LYD_PARSE_NO_NEW) {
        node->flags &= ~LYD_NEW;
    }

    if (lysc_has_when(node->schema)) {
        if (lydctx->parse_opts & LYD_PARSE_WHEN_TRUE) {
            /* the condition was true before */
            node->flags |= LYD_WHEN_TRUE;
        }
        if (!(lydctx->parse_opts & LYD_PARSE_ONLY)) {
            /* remember we need to evaluate this node's when */
            LY_CHECK_RET(ly_set_add(&lydctx->node_when, node, 1, NULL));
        }
    }

    LY_LIST_FOR(*meta, meta2) {
        if (!strcmp(meta2->name, "default") && !strcmp(meta2->annotation->module->name, "ietf-netconf-with-defaults") &&
                meta2->value.boolean) {
            /* node is default according to the metadata */
            node->flags |= LYD_DEFAULT;

            next_meta = meta2->next;

            /* delete the metadata */
            if (meta != &node->meta) {
                *meta = (*meta)->next;
            }
            lyd_free_meta_single(meta2);
            if (prev_meta) {
                prev_meta->next = next_meta;
            }

            /* update dflt flag for all parent NP containers */
            lyd_np_cont_dflt_set(lyd_parent(node));
            break;
        }

        prev_meta = meta2;
    }

    if (ext) {
        /* parsed for an extension */
        node->flags |= LYD_EXT;

        if (!(lydctx->parse_opts & LYD_PARSE_ONLY)) {
            /* rememeber for validation */
            ext_val = malloc(sizeof *ext_val);
            LY_CHECK_ERR_RET(!ext_val, LOGMEM(LYD_CTX(node)), LY_EMEM);
            ext_val->ext = ext;
            ext_val->sibling = node;
            LY_CHECK_RET(ly_set_add(&lydctx->ext_val, ext_val, 1, NULL));
        }
    }

    return LY_SUCCESS;
}